

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool re2::RE2::Arg::parse_ushort_radix(char *str,size_t n,void *dest,int radix)

{
  bool bVar1;
  undefined2 *in_RDX;
  undefined8 in_RDI;
  size_t unaff_retaddr;
  unsigned_long r;
  undefined8 local_30;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = parse_ulong_radix((char *)r,unaff_retaddr,
                            (void *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                            (int)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    if ((local_30 & 0xffff) == local_30) {
      if (in_RDX == (undefined2 *)0x0) {
        bVar1 = true;
      }
      else {
        *in_RDX = (short)local_30;
        bVar1 = true;
      }
    }
    else {
      bVar1 = false;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool RE2::Arg::parse_ushort_radix(const char* str,
                                  size_t n,
                                  void* dest,
                                  int radix) {
  unsigned long r;
  if (!parse_ulong_radix(str, n, &r, radix)) return false;  // Could not parse
  if ((unsigned short)r != r) return false;                 // Out of range
  if (dest == NULL) return true;
  *(reinterpret_cast<unsigned short*>(dest)) = (unsigned short)r;
  return true;
}